

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processDisconnect(CoreBroker *this)

{
  bool in_stack_0000004f;
  CoreBroker *in_stack_00000050;
  
  processDisconnect(in_stack_00000050,in_stack_0000004f);
  return;
}

Assistant:

void CoreBroker::processDisconnect(bool skipUnregister)
{
    auto cBrokerState = getBrokerState();
    if (cBrokerState >= BrokerState::TERMINATING) {
        return;
    }
    if (cBrokerState > BrokerState::CONFIGURED) {
        LOG_CONNECTIONS(parent_broker_id, getIdentifier(), "||disconnecting");
        setBrokerState(BrokerState::TERMINATING);
        brokerDisconnect();
    }
    setBrokerState(BrokerState::TERMINATED);

    if (!skipUnregister) {
        unregister();
    }
    disconnection.trigger();
}